

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

float Abc_BufComputeArr(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint i_00;
  int iVar2;
  Abc_Obj_t *pObj_00;
  float local_2c;
  float Delay;
  float DelayF;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  Buf_Man_t *p_local;
  
  local_2c = -1e+09;
  for (Delay = 0.0; iVar1 = Abc_ObjFaninNum(pObj), (int)Delay < iVar1;
      Delay = (float)((int)Delay + 1)) {
    pObj_00 = Abc_ObjFanin(pObj,(int)Delay);
    p_00 = p->vOffsets;
    i_00 = Abc_ObjId(pObj);
    iVar1 = Vec_IntEntry(p_00,i_00);
    if (iVar1 != -1000000000) {
      iVar1 = Abc_BufNodeArr(p,pObj_00);
      iVar2 = Abc_BufEdgeDelay(p,pObj,(int)Delay);
      if (local_2c < (float)(iVar1 + iVar2)) {
        local_2c = (float)(iVar1 + iVar2);
      }
    }
  }
  Abc_BufSetNodeArr(p,pObj,(int)local_2c);
  return local_2c;
}

Assistant:

float Abc_BufComputeArr( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    float DelayF, Delay = -ABC_INFINITY;
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        if ( Vec_IntEntry(p->vOffsets, Abc_ObjId(pObj)) == -ABC_INFINITY )
            continue;
        DelayF = Abc_BufNodeArr(p, pFanin) + Abc_BufEdgeDelay(p, pObj, i);
        if ( Delay < DelayF )
            Delay = DelayF;
    }
    Abc_BufSetNodeArr( p, pObj, Delay );
    return Delay;
}